

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O3

int lws_http_transaction_completed_client(lws *wsi)

{
  allocated_headers *paVar1;
  int iVar2;
  lws *in_RDI;
  lws *local_18;
  
  local_18 = in_RDI;
  _lws_log(8,"%s: wsi: %p (%s)\n","lws_http_transaction_completed_client");
  iVar2 = user_callback_handle_rxflow
                    (in_RDI->protocol->callback,in_RDI,LWS_CALLBACK_COMPLETED_CLIENT_HTTP,
                     in_RDI->user_space,(void *)0x0,0);
  if (iVar2 != 0) {
    _lws_log(0x10,"%s: Completed call returned nonzero (role 0x%lx)\n",
             "lws_http_transaction_completed_client",
             (ulong)*(ushort *)((long)&in_RDI->wsistate + 2) << 0x10);
    return -1;
  }
  (in_RDI->http).rx_content_length = 0;
  iVar2 = _lws_generic_transaction_completed_active_conn(&local_18);
  paVar1 = (local_18->http).ah;
  if (paVar1 != (allocated_headers *)0x0) {
    if ((local_18->field_0x2e2 & 0x80) == 0) {
      if (iVar2 == 0) {
        _lws_header_table_reset(paVar1);
        return 0;
      }
      goto LAB_001278ff;
    }
    __lws_header_table_detach(local_18,0);
  }
  if (iVar2 == 0) {
    return 0;
  }
  if ((local_18->http).ah == (allocated_headers *)0x0) {
    return 0;
  }
LAB_001278ff:
  lwsi_set_state(local_18,0x20b);
  paVar1 = (local_18->http).ah;
  paVar1->parser_state = '`';
  paVar1->lextable_pos = 0;
  paVar1->unk_pos = 0;
  lws_set_timeout(local_18,PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,local_18->context->timeout_secs)
  ;
  ((local_18->http).ah)->ues = '\0';
  lwsi_set_state(local_18,0x13);
  _lws_log(8,"%s: %p: new queued transaction\n","lws_http_transaction_completed_client",local_18);
  lws_callback_on_writable(local_18);
  return 0;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_http_transaction_completed_client(struct lws *wsi)
{
	int n;

	lwsl_info("%s: wsi: %p (%s)\n", __func__, wsi, wsi->protocol->name);

	if (user_callback_handle_rxflow(wsi->protocol->callback, wsi,
					LWS_CALLBACK_COMPLETED_CLIENT_HTTP,
					wsi->user_space, NULL, 0)) {
		lwsl_debug("%s: Completed call returned nonzero (role 0x%lx)\n",
			   __func__, (unsigned long)lwsi_role(wsi));
		return -1;
	}

	wsi->http.rx_content_length = 0;

	/*
	 * For h1, wsi may pass some assets on to a queued child and be
	 * destroyed during this.
	 */
	n = _lws_generic_transaction_completed_active_conn(&wsi);

	if (wsi->http.ah) {
		if (wsi->client_mux_substream)
			/*
			 * As an h2 client, once we did our transaction, that is
			 * it for us.  Further transactions will happen as new
			 * SIDs on the connection.
			 */
			__lws_header_table_detach(wsi, 0);
		else
			if (!n)
				_lws_header_table_reset(wsi->http.ah);
	}

	if (!n || !wsi->http.ah)
		return 0;

	/*
	 * H1: we can serialize the queued guys into the same ah
	 * H2: everybody needs their own ah until their own STREAM_END
	 */

	/* otherwise set ourselves up ready to go again */
	lwsi_set_state(wsi, LRS_WAITING_SERVER_REPLY);

	wsi->http.ah->parser_state = WSI_TOKEN_NAME_PART;
	wsi->http.ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
	wsi->http.ah->unk_pos = 0;
#endif

	lws_set_timeout(wsi, PENDING_TIMEOUT_AWAITING_SERVER_RESPONSE,
			wsi->context->timeout_secs);

	/* If we're (re)starting on headers, need other implied init */
	wsi->http.ah->ues = URIES_IDLE;
	lwsi_set_state(wsi, LRS_H1C_ISSUE_HANDSHAKE2);

	lwsl_info("%s: %p: new queued transaction\n", __func__, wsi);
	lws_callback_on_writable(wsi);

	return 0;
}